

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

dtime_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::dtime_t,duckdb::QuantileIndirect<duckdb::dtime_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::dtime_t> *accessor)

{
  DataChunk *pDVar1;
  CURSOR *pCVar2;
  dtime_t dVar3;
  bool bVar4;
  dtime_t dVar5;
  bool bVar6;
  reference pvVar7;
  double dVar8;
  undefined1 auVar9 [16];
  dtime_t result_1;
  dtime_t local_58;
  string local_50;
  
  pCVar2 = accessor->data;
  bVar4 = (pCVar2->scan).next_row_index <= lidx;
  bVar6 = lidx < (pCVar2->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar6 || bVar4) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (dtime_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar2->validity = &pvVar7->validity;
    }
    dVar3.micros = pCVar2->data[(uint)((int)lidx - (int)(pCVar2->scan).current_row_index)].micros;
    bVar6 = TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar3,&local_58,false);
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_50,(duckdb *)dVar3.micros,(dtime_t)auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (bVar6 || bVar4) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (dtime_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar2->validity = &pvVar7->validity;
    }
    dVar3.micros = pCVar2->data[(uint)((int)lidx - (int)(pCVar2->scan).current_row_index)].micros;
    bVar6 = TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar3,&local_58,false);
    dVar5.micros = local_58.micros;
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_50,(duckdb *)dVar3.micros,(dtime_t)auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= hidx) || (hidx < (pCVar2->scan).current_row_index)) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,hidx,&pCVar2->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (dtime_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar2->validity = &pvVar7->validity;
    }
    dVar3.micros = pCVar2->data[(uint)((int)hidx - (int)(pCVar2->scan).current_row_index)].micros;
    bVar6 = TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar3,&local_58,false);
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_50,(duckdb *)dVar3.micros,(dtime_t)auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    dVar8 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_58.micros =
         llround(dVar8 * (double)local_58.micros + (1.0 - dVar8) * (double)dVar5.micros);
  }
  return (dtime_t)local_58.micros;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}